

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

bool soul::isSafeIdentifierName(string *s)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  string local_58;
  string local_38;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar1,pcVar1 + s->_M_string_length)
  ;
  makeSafeIdentifierName(&local_38,&local_58);
  __n = s->_M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((s->_M_dataplus)._M_p,local_38._M_dataplus._M_p,__n);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool isSafeIdentifierName (std::string s)
{
    return s == makeSafeIdentifierName (s);
}